

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O0

void pzshape::TPZShapeTriang::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int *piVar8;
  double *pdVar9;
  TPZVec<int> *in_RSI;
  double col;
  double dVar10;
  double dVar11;
  int is3;
  int is2;
  int is1;
  int is2_1;
  int is1_1;
  int is;
  REAL mult [7];
  int64_t in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe88;
  double dVar12;
  TPZFMatrix<double> *in_stack_fffffffffffffe90;
  TPZFMatrix<double> *this;
  int local_5c;
  double local_58 [6];
  double local_28;
  TPZVec<int> *local_10;
  
  local_10 = in_RSI;
  memcpy(local_58,&DAT_02098360,0x38);
  for (local_5c = 3; dVar12 = local_28, local_5c < 6; local_5c = local_5c + 1) {
    piVar8 = TPZVec<int>::operator[](local_10,(long)local_5c + -3);
    if (0 < *piVar8) {
      dVar12 = local_58[local_5c];
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar1 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar2 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      *pdVar9 = dVar12 * dVar1 * dVar2;
      dVar12 = local_58[local_5c];
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar1 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar2 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar3 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar4 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      *pdVar9 = dVar12 * (dVar1 * dVar2 + dVar3 * dVar4);
      dVar12 = local_58[local_5c];
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar1 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar2 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar3 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      dVar4 = *pdVar9;
      pdVar9 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
      *pdVar9 = dVar12 * (dVar1 * dVar2 + dVar3 * dVar4);
    }
  }
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80)
  ;
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80)
  ;
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80)
  ;
  col = dVar12 * dVar1 * dVar2 * *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(int64_t)col);
  dVar6 = local_28;
  *pdVar9 = col;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(int64_t)col);
  dVar12 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(in_stack_fffffffffffffe90,(int64_t)dVar12,(int64_t)col);
  dVar10 = dVar12 * *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(in_stack_fffffffffffffe90,(int64_t)dVar12,(int64_t)col);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(in_stack_fffffffffffffe90,(int64_t)dVar12,(int64_t)col);
  this = (TPZFMatrix<double> *)*pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar11 = (double)this * *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar3 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar4 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar5 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  *pdVar9 = dVar6 * (dVar3 * dVar4 * dVar5 + dVar10 * dVar1 + dVar11 * dVar2);
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar3 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar4 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar5 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar6 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar10 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar11 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  dVar7 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()(this,(int64_t)dVar12,(int64_t)col);
  *pdVar9 = local_28 * (dVar10 * dVar11 * dVar7 + dVar1 * dVar2 * dVar3 + dVar4 * dVar5 * dVar6);
  return;
}

Assistant:

void TPZShapeTriang::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        // Make the generating shape functions linear and unitary
        REAL mult[] = {1.,1.,1.,4.,4.,4.,27.};
        int is;
        for(is=3; is<6; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            int is1 = is%3;
            int is2 = (is+1)%3;
            phi(is,0) = mult[is]*phi(is1,0)*phi(is2,0);
            dphi(0,is) = mult[is]*(dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2));
            dphi(1,is) = mult[is]*(dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2));
        }
        int is1 = 0;
        int is2 = 1;
        int is3 = 2;
        phi(is,0) = mult[6]*phi(is1,0)*phi(is2,0)*phi(is3,0);
        dphi(0,is) = mult[6]*( dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3));
        dphi(1,is) = mult[6]*( dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3));
        
    }